

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaD_reallocstack(lua_State *L,int newsize)

{
  TValue *oldstack_00;
  StkId local_30;
  int realsize;
  TValue *oldstack;
  int newsize_local;
  lua_State *L_local;
  
  oldstack_00 = L->stack;
  if ((ulong)(long)(newsize + 7) < 0x1000000000000000) {
    local_30 = (StkId)luaM_realloc_(L,L->stack,(long)L->stacksize << 4,(long)(newsize + 6) << 4);
  }
  else {
    local_30 = (StkId)luaM_toobig(L);
  }
  L->stack = local_30;
  L->stacksize = newsize + 6;
  L->stack_last = L->stack + newsize;
  correctstack(L,oldstack_00);
  return;
}

Assistant:

static void luaD_reallocstack(lua_State*L,int newsize){
TValue*oldstack=L->stack;
int realsize=newsize+1+5;
luaM_reallocvector(L,L->stack,L->stacksize,realsize,TValue);
L->stacksize=realsize;
L->stack_last=L->stack+newsize;
correctstack(L,oldstack);
}